

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::istream_cs_ext::parse_value(istream_cs_ext *this,string *str)

{
  bool bVar1;
  anon_union_16_2_310e9938_for_data local_38 [2];
  
  bVar1 = std::operator==(str,"true");
  if (bVar1) {
    local_38[0]._int._0_1_ = 1;
  }
  else {
    bVar1 = std::operator==(str,"false");
    if (!bVar1) {
      cs::parse_number((numeric *)local_38,str);
      any::any<cs::numeric>((any *)this,(numeric *)local_38);
      return (var)(proxy *)this;
    }
    local_38[0]._int._0_1_ = 0;
  }
  any::any<bool>((any *)this,(bool *)local_38);
  return (var)(proxy *)this;
}

Assistant:

var parse_value(const std::string &str)
		{
			if (str == "true")
				return true;
			if (str == "false")
				return false;
			try {
				return parse_number(str);
			}
			catch (...) {
				return str;
			}
			return str;
		}